

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexFinder.cpp
# Opt level: O0

int __thiscall OpenMD::IndexFinder::init(IndexFinder *this,EVP_PKEY_CTX *ctx)

{
  SelectionSet ss;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  RigidBody *rb;
  Atom *atom;
  Molecule *mol;
  InversionIterator inversionIter;
  TorsionIterator torsionIter;
  BendIterator bendIter;
  BondIterator bondIter;
  RigidBodyIterator rbIter;
  AtomIterator ai;
  MoleculeIterator mi;
  vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  reference in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  SimInfo *in_stack_fffffffffffffe80;
  Bend *in_stack_fffffffffffffea8;
  reference in_stack_fffffffffffffeb0;
  vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> local_90;
  SimInfo *local_78;
  Torsion *local_70;
  Bend *local_68;
  Bond *local_60;
  RigidBody *local_58;
  Atom *local_50;
  Molecule *local_48;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_40;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_38;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_30;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_28;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_20;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_18;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_10;
  IndexFinder *local_8;
  
  local_8 = this;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_10);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_40);
  local_48 = SimInfo::beginMolecule
                       (in_stack_fffffffffffffe80,
                        (MoleculeIterator *)
                        CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  while (local_48 != (Molecule *)0x0) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffeb0,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
    SelectionSet::SelectionSet
              ((SelectionSet *)in_stack_fffffffffffffeb0,
               (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea8);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe70);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
              (&local_90,5);
    Molecule::getGlobalIndex(local_48);
    OpenMDBitSet::setBitOn
              ((OpenMDBitSet *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (size_t)in_stack_fffffffffffffe58);
    local_50 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffe80,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    while (local_50 != (Atom *)0x0) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&local_90,0);
      StuntDouble::getGlobalIndex(&local_50->super_StuntDouble);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (size_t)in_stack_fffffffffffffe58);
      local_50 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffffe80,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    local_58 = Molecule::beginRigidBody
                         ((Molecule *)in_stack_fffffffffffffe80,
                          (iterator *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
    ;
    while (local_58 != (RigidBody *)0x0) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&local_90,0);
      StuntDouble::getGlobalIndex(&local_58->super_StuntDouble);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (size_t)in_stack_fffffffffffffe58);
      local_58 = Molecule::nextRigidBody
                           ((Molecule *)in_stack_fffffffffffffe80,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    local_60 = Molecule::beginBond((Molecule *)in_stack_fffffffffffffe80,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    while (local_60 != (Bond *)0x0) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&local_90,1);
      ShortRangeInteraction::getGlobalIndex(&local_60->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (size_t)in_stack_fffffffffffffe58);
      local_60 = Molecule::nextBond((Molecule *)in_stack_fffffffffffffe80,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    local_68 = Molecule::beginBend((Molecule *)in_stack_fffffffffffffe80,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    while (local_68 != (Bend *)0x0) {
      in_stack_fffffffffffffeb0 =
           std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                     (&local_90,2);
      ShortRangeInteraction::getGlobalIndex(&local_68->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (size_t)in_stack_fffffffffffffe58);
      in_stack_fffffffffffffea8 =
           Molecule::nextBend((Molecule *)in_stack_fffffffffffffe80,
                              (iterator *)
                              CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_68 = in_stack_fffffffffffffea8;
    }
    local_70 = Molecule::beginTorsion
                         ((Molecule *)in_stack_fffffffffffffe80,
                          (iterator *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78))
    ;
    while (local_70 != (Torsion *)0x0) {
      std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                (&local_90,3);
      ShortRangeInteraction::getGlobalIndex(&local_70->super_ShortRangeInteraction);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (size_t)in_stack_fffffffffffffe58);
      local_70 = Molecule::nextTorsion
                           ((Molecule *)in_stack_fffffffffffffe80,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    in_stack_fffffffffffffe80 =
         (SimInfo *)
         Molecule::beginInversion
                   ((Molecule *)in_stack_fffffffffffffe80,
                    (iterator *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    local_78 = in_stack_fffffffffffffe80;
    while (local_78 != (SimInfo *)0x0) {
      in_stack_fffffffffffffe70 =
           std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::operator[]
                     (&local_90,4);
      in_stack_fffffffffffffe7c =
           ShortRangeInteraction::getGlobalIndex((ShortRangeInteraction *)local_78);
      OpenMDBitSet::setBitOn
                ((OpenMDBitSet *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (size_t)in_stack_fffffffffffffe58);
      local_78 = (SimInfo *)
                 Molecule::nextInversion
                           ((Molecule *)in_stack_fffffffffffffe80,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
    }
    in_stack_fffffffffffffe58 = &this->selectionSets_;
    in_stack_fffffffffffffe64 = Molecule::getGlobalIndex(local_48);
    std::vector<OpenMD::SelectionSet,_std::allocator<OpenMD::SelectionSet>_>::operator[]
              (in_stack_fffffffffffffe58,(long)in_stack_fffffffffffffe64);
    SelectionSet::operator=
              ((SelectionSet *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               (SelectionSet *)in_stack_fffffffffffffe58);
    SelectionSet::~SelectionSet((SelectionSet *)0x43af9d);
    local_48 = SimInfo::nextMolecule
                         (in_stack_fffffffffffffe80,
                          (MoleculeIterator *)
                          CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
  }
  return 0;
}

Assistant:

void IndexFinder::init() {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      SelectionSet ss(nObjects_);

      ss.bitsets_[MOLECULE].setBitOn(mol->getGlobalIndex());

      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(atom->getGlobalIndex());
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        ss.bitsets_[STUNTDOUBLE].setBitOn(rb->getGlobalIndex());
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        ss.bitsets_[BOND].setBitOn(bond->getGlobalIndex());
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        ss.bitsets_[BEND].setBitOn(bend->getGlobalIndex());
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        ss.bitsets_[TORSION].setBitOn(torsion->getGlobalIndex());
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        ss.bitsets_[INVERSION].setBitOn(inversion->getGlobalIndex());
      }

      selectionSets_[mol->getGlobalIndex()] = ss;
    }
  }